

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::simplify(Solver *this)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  size_type sVar4;
  DecisionHeuristic *pDVar5;
  long in_RDI;
  uint32 old;
  Solver *in_stack_00000028;
  bool local_1;
  
  uVar3 = decisionLevel((Solver *)0x1e7478);
  if (uVar3 == 0) {
    bVar2 = hasConflict((Solver *)0x1e7491);
    if (bVar2) {
      local_1 = false;
    }
    else {
      uVar1 = *(uint *)(in_RDI + 0x204);
      sVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                        ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                         (in_RDI + 200));
      if ((uVar1 & 0x3fffffff) != sVar4) {
        uVar1 = *(uint *)(in_RDI + 0x204);
        bVar2 = simplifySAT(in_stack_00000028);
        if (!bVar2) {
          return false;
        }
        pDVar5 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                           ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)
                            0x1e74fd);
        (*pDVar5->_vptr_DecisionHeuristic[7])(pDVar5,in_RDI,(ulong)(uVar1 & 0x3fffffff));
      }
      if ((*(uint *)(in_RDI + 0x204) >> 0x1e & 1) != 0) {
        simplifySAT(in_stack_00000028);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Solver::simplify() {
	if (decisionLevel() != 0) return true;
	if (hasConflict())        return false;
	if (lastSimp_ != (uint32)assign_.trail.size()) {
		uint32 old = lastSimp_;
		if (!simplifySAT()) { return false; }
		assert(lastSimp_ == (uint32)assign_.trail.size());
		heuristic_->simplify(*this, old);
	}
	if (shufSimp_) { simplifySAT(); }
	return true;
}